

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O1

PyObject * __thiscall
boost::python::detail::caller_arity<3U>::
impl<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::default_call_policies,_boost::mpl::vector4<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
::operator()(impl<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::default_call_policies,_boost::mpl::vector4<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             *this,PyObject *args_,PyObject *param_2)

{
  _object *p_Var1;
  PyTypeObject *pPVar2;
  long lVar3;
  long *plVar4;
  PyObject *pPVar5;
  code *pcVar6;
  c_t1 c1;
  c_t2 c2;
  long *local_a8 [2];
  long local_98 [2];
  undefined1 local_88 [16];
  long *local_78 [2];
  long local_68 [2];
  _object *local_58;
  undefined1 local_40 [24];
  PyTypeObject *local_28;
  
  lVar3 = converter::get_lvalue_from_python
                    ((_object *)args_[1].ob_type,
                     converter::detail::registered_base<AbstractModuleClient_const_volatile&>::
                     converters);
  if (lVar3 == 0) {
    return (PyObject *)0x0;
  }
  p_Var1 = (_object *)args_[2].ob_refcnt;
  local_88 = converter::rvalue_from_python_stage1
                       (p_Var1,converter::detail::
                               registered_base<std::__cxx11::string_const_volatile&>::converters);
  local_58 = p_Var1;
  if (local_88._0_8_ != 0) {
    pPVar2 = args_[2].ob_type;
    local_40._0_16_ =
         converter::rvalue_from_python_stage1
                   ((_object *)pPVar2,
                    converter::detail::registered_base<unsigned_int_const_volatile&>::converters);
    local_28 = pPVar2;
    if (local_40._0_8_ != 0) {
      pcVar6 = (code *)(this->m_data).
                       super_compressed_pair_imp<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::default_call_policies,_2>
                       .first_;
      plVar4 = (long *)(lVar3 + *(long *)&(this->m_data).
                                          super_compressed_pair_imp<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::default_call_policies,_2>
                                          .field_0x8);
      if (((ulong)pcVar6 & 1) != 0) {
        pcVar6 = *(code **)(pcVar6 + *plVar4 + -1);
      }
      if ((code *)local_88._8_8_ != (code *)0x0) {
        (*(code *)local_88._8_8_)(local_58);
      }
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,*(long *)local_88._0_8_,
                 *(long *)(local_88._0_8_ + 8) + *(long *)local_88._0_8_);
      if ((code *)local_40._8_8_ != (code *)0x0) {
        (*(code *)local_40._8_8_)(local_28);
      }
      (*pcVar6)(plVar4,local_a8,*(undefined4 *)local_40._0_8_);
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0],local_98[0] + 1);
      }
      pPVar5 = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      goto LAB_00244d29;
    }
  }
  pPVar5 = (PyObject *)0x0;
LAB_00244d29:
  if (((long **)local_88._0_8_ == local_78) && (local_78[0] != local_68)) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return pPVar5;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }